

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  pointer *ppTVar1;
  undefined8 uVar2;
  Function FVar3;
  TextureType TVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Texture2D *this_00;
  TextureCube *this_01;
  long lVar9;
  IVec4 *pIVar10;
  int iVar11;
  int iVar12;
  undefined8 *puVar13;
  iterator __position;
  long lVar14;
  int face;
  long lVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  CubeFaceFloatCoords CVar25;
  Vec2 f;
  IVec2 viewportSize;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  float local_140 [2];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_120 [8];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float local_f0;
  int local_ec;
  undefined1 local_e8 [16];
  Vec4 local_d8;
  TextureBinding local_c8;
  TextureFormat local_80;
  TestContext *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  _Alloc_hider _Stack_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  float afStack_40 [4];
  
  bVar16 = 0;
  if (initTexture()::texCubeSwz == '\0') {
    initTexture();
  }
  local_80 = glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&local_78,&local_80);
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)local_120);
  FVar3 = (this->m_lookupSpec).function;
  local_e8._0_12_ = ZEXT812(0x3f800000);
  local_e8._12_4_ = 0;
  if ((FVar3 < FUNCTION_LAST) && ((0x36U >> (FVar3 & 0x1f) & 1) != 0)) {
    local_e8 = ZEXT416((uint)(1.0 / (this->m_lookupSpec).minCoord.m_data
                                    [FVar3 == FUNCTION_TEXTUREPROJ3 ^ 3]));
  }
  TVar4 = (this->m_textureSpec).type;
  if (TVar4 == TEXTURETYPE_CUBE_MAP) {
    iVar7 = (this->m_textureSpec).numLevels + -1;
    iVar12 = 1;
    if (1 < iVar7) {
      iVar12 = iVar7;
    }
    local_118 = local_78;
    uStack_110 = (pointer)aStack_70._M_allocated_capacity;
    local_108 = (TestContext *)aStack_70._8_8_;
    _fStack_100 = _Stack_60._M_p;
    iVar7 = (this->m_textureSpec).width;
    iVar5 = (this->m_textureSpec).height;
    iVar8 = iVar7 + 3;
    if (-1 < iVar7) {
      iVar8 = iVar7;
    }
    iVar11 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar11 = iVar5;
    }
    local_ec = iVar11 >> 2;
    if (iVar8 >> 2 < iVar11 >> 2) {
      local_ec = iVar8 >> 2;
    }
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar7);
    this->m_textureCube = this_01;
    if (0 < (this->m_textureSpec).numLevels) {
      fVar19 = (float)local_108 - (float)local_118;
      fVar20 = local_108._4_4_ - local_118._4_4_;
      fStack_100 = fStack_100 - (float)uStack_110;
      fStack_fc = fStack_fc - uStack_110._4_4_;
      local_f0 = 1.0 / (float)iVar12;
      local_138 = 0;
      local_108 = (TestContext *)CONCAT44(fVar20,fVar19);
      fVar21 = fStack_100;
      fVar23 = fStack_fc;
      do {
        local_140[0] = (float)(int)local_138 * local_f0;
        local_140[1] = 1.0 - local_140[0];
        iVar12 = local_ec >> ((byte)local_138 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        lVar15 = 0xb0;
        lVar9 = local_138 * 0x28;
        pIVar10 = initTexture::texCubeSwz;
        lVar14 = 0;
        fVar17 = (float)local_118;
        fVar18 = local_118._4_4_;
        fVar22 = (float)uStack_110;
        fVar24 = uStack_110._4_4_;
        do {
          local_c8.m_sampler.wrapS = (WrapMode)(local_140[pIVar10->m_data[1]] * fVar20 + fVar18);
          local_c8.m_type = (Type)(local_140[pIVar10->m_data[0]] * fVar19 + fVar17);
          local_c8.m_sampler.wrapT = (WrapMode)(local_140[pIVar10->m_data[2]] * fVar21 + fVar22);
          local_c8.m_sampler.wrapR = (WrapMode)(local_140[pIVar10->m_data[3]] * fVar23 + fVar24);
          local_d8.m_data[0] = local_140[1 - pIVar10->m_data[0]] * fVar19 + fVar17;
          local_d8.m_data[1] = local_140[1 - pIVar10->m_data[1]] * fVar20 + fVar18;
          local_d8.m_data[2] = local_140[1 - pIVar10->m_data[2]] * fVar21 + fVar22;
          local_d8.m_data[3] = local_140[1 - pIVar10->m_data[3]] * fVar23 + fVar24;
          tcu::TextureCube::allocLevel
                    (&this->m_textureCube->m_refTexture,(CubeFace)lVar14,(int)local_138);
          tcu::fillWithGrid((PixelBufferAccess *)
                            (*(long *)((long)(this->m_textureCube->m_refTexture).m_data +
                                      lVar15 + -0x20) + lVar9),iVar12,(Vec4 *)&local_c8,&local_d8);
          lVar14 = lVar14 + 1;
          pIVar10 = pIVar10 + 1;
          lVar15 = lVar15 + 0x18;
          fVar17 = (float)local_118;
          fVar18 = local_118._4_4_;
          fVar22 = (float)uStack_110;
          fVar24 = uStack_110._4_4_;
          fVar19 = (float)local_108;
          fVar20 = local_108._4_4_;
          fVar21 = fStack_100;
          fVar23 = fStack_fc;
        } while (lVar14 != 6);
        local_138 = local_138 + 1;
      } while ((long)local_138 < (long)(this->m_textureSpec).numLevels);
      this_01 = this->m_textureCube;
    }
    glu::TextureCube::upload(this_01);
    local_c8.m_sampler.wrapT =
         (WrapMode)((this->m_lookupSpec).minCoord.m_data[2] * (float)local_e8._0_4_);
    uVar2 = *(undefined8 *)(this->m_lookupSpec).minCoord.m_data;
    local_138 = CONCAT44(local_e8._0_4_,local_e8._0_4_);
    uStack_130 = (pointer)CONCAT44(local_e8._0_4_,local_e8._0_4_);
    local_c8._0_8_ =
         CONCAT44((float)((ulong)uVar2 >> 0x20) * (float)local_e8._0_4_,
                  (float)uVar2 * (float)local_e8._0_4_);
    CVar25 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    local_108 = (TestContext *)CONCAT44(local_108._4_4_,CVar25.t);
    local_c8.m_sampler.wrapT =
         (WrapMode)((this->m_lookupSpec).minCoord.m_data[2] * (float)local_e8._0_4_);
    local_c8._0_8_ =
         CONCAT44((this->m_lookupSpec).minCoord.m_data[1] * local_138._4_4_,
                  (this->m_lookupSpec).maxCoord.m_data[0] * (float)local_138);
    local_118._0_4_ = CVar25.s;
    CVar25 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    local_118 = (TestContext *)CONCAT44(local_118._4_4_,CVar25.s - (float)local_118);
    local_c8.m_sampler.wrapT =
         (WrapMode)((float)local_e8._0_4_ * (this->m_lookupSpec).minCoord.m_data[2]);
    local_c8._0_8_ =
         CONCAT44((this->m_lookupSpec).maxCoord.m_data[1] * local_138._4_4_,
                  (this->m_lookupSpec).minCoord.m_data[0] * (float)local_138);
    CVar25 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    fVar19 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (float)local_118) /
                        (float)(int)local_120._0_4_,0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar25.t - (float)local_108)) /
                        (float)(int)local_120._4_4_);
    (this->m_lookupParams).lod = fVar19;
    deqp::gls::TextureBinding::TextureBinding
              (&local_c8,this->m_textureCube,&(this->m_textureSpec).sampler);
  }
  else {
    if (TVar4 != TEXTURETYPE_2D) goto LAB_00f2a1c1;
    iVar7 = (this->m_textureSpec).numLevels + -1;
    iVar12 = 1;
    if (1 < iVar7) {
      iVar12 = iVar7;
    }
    local_108 = local_78;
    _fStack_100 = aStack_70._M_allocated_capacity;
    local_138 = aStack_70._8_8_;
    uStack_130 = _Stack_60._M_p;
    iVar7 = (this->m_textureSpec).width;
    iVar5 = (this->m_textureSpec).height;
    iVar8 = iVar7 + 3;
    if (-1 < iVar7) {
      iVar8 = iVar7;
    }
    iVar11 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar11 = iVar5;
    }
    iVar6 = iVar11 >> 2;
    if (iVar8 >> 2 < iVar11 >> 2) {
      iVar6 = iVar8 >> 2;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar7,iVar5);
    this->m_texture2D = this_00;
    if (0 < (this->m_textureSpec).numLevels) {
      fVar19 = (float)local_138 - (float)local_108;
      fVar20 = local_138._4_4_ - local_108._4_4_;
      fVar21 = (float)uStack_130 - fStack_100;
      fVar23 = uStack_130._4_4_ - fStack_fc;
      local_118 = (TestContext *)CONCAT44(local_118._4_4_,1.0 / (float)iVar12);
      lVar9 = 0;
      lVar14 = 0;
      local_138 = CONCAT44(fVar20,fVar19);
      uStack_130 = (pointer)CONCAT44(fVar23,fVar21);
      do {
        fVar17 = (float)(int)lVar14 * (float)local_118;
        fVar18 = 1.0 - fVar17;
        local_c8.m_sampler.wrapT = (WrapMode)(fVar17 * fVar21 + fStack_100);
        local_c8.m_sampler.wrapR = (WrapMode)(fVar18 * fVar23 + fStack_fc);
        local_c8.m_sampler.wrapS = (WrapMode)(fVar18 * fVar20 + local_108._4_4_);
        local_c8.m_type = (Type)(fVar17 * fVar19 + (float)local_108);
        local_d8.m_data[0] = fVar18 * fVar19 + (float)local_108;
        local_d8.m_data[1] = fVar17 * fVar20 + local_108._4_4_;
        local_d8.m_data[2] = fVar18 * fVar21 + fStack_100;
        local_d8.m_data[3] = fVar17 * fVar23 + fStack_fc;
        tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar14);
        iVar12 = iVar6 >> ((byte)lVar14 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        tcu::fillWithGrid((PixelBufferAccess *)
                          ((long)(((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.
                                   m_access.
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),iVar12,
                          (Vec4 *)&local_c8,&local_d8);
        lVar14 = lVar14 + 1;
        lVar9 = lVar9 + 0x28;
        fVar19 = (float)local_138;
        fVar20 = local_138._4_4_;
        fVar21 = (float)uStack_130;
        fVar23 = uStack_130._4_4_;
      } while (lVar14 < (this->m_textureSpec).numLevels);
      this_00 = this->m_texture2D;
    }
    (*this_00->_vptr_Texture2D[2])();
    fVar19 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * (float)local_e8._0_4_) /
                        (float)(int)local_120._0_4_,0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * (float)local_e8._0_4_) /
                        (float)(int)local_120._4_4_);
    (this->m_lookupParams).lod = fVar19;
    deqp::gls::TextureBinding::TextureBinding
              (&local_c8,this->m_texture2D,&(this->m_textureSpec).sampler);
  }
  __position._M_current =
       (this->super_ShaderRenderCase).m_textures.
       super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_ShaderRenderCase).m_textures.
      super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    _M_realloc_insert<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,__position,&local_c8);
  }
  else {
    puVar13 = (undefined8 *)&local_c8;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      uVar2 = *puVar13;
      (__position._M_current)->m_type = (int)uVar2;
      ((__position._M_current)->m_sampler).wrapS = (int)((ulong)uVar2 >> 0x20);
      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
      __position._M_current = __position._M_current + (ulong)bVar16 * -0x10 + 8;
    }
    ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
               super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
LAB_00f2a1c1:
  *(size_type *)(this->m_lookupParams).scale.m_data = local_58;
  *(size_type *)((this->m_lookupParams).scale.m_data + 2) = aStack_50._M_allocated_capacity;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = aStack_50._8_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = afStack_40._0_8_;
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);
					tcu::fillWithGrid(m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
}